

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnFuncType
          (BinaryReaderIR *this,Index index,Index param_count,Type *param_types,Index result_count,
          Type *result_types)

{
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var1;
  char *pcVar2;
  TypeModuleField *local_60;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_58;
  Location local_50;
  
  GetLocation(&local_50,this);
  MakeUnique<wabt::TypeModuleField,wabt::Location>((wabt *)&local_60,&local_50);
  MakeUnique<wabt::FuncType>();
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)((long)local_50.filename.data_ + 0x50)
             ,param_types,param_types + param_count);
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)
             &(((TypeEntry *)((long)local_50.filename.data_ + 0x50))->loc).field_1,result_types,
             result_types + result_count);
  pcVar2 = local_50.filename.data_;
  local_50.filename.data_ = (char *)0x0;
  _Var1._M_head_impl =
       (local_60->type)._M_t.
       super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
       super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
       super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
  (local_60->type)._M_t.
  super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)pcVar2;
  local_58._M_head_impl = local_60;
  if (_Var1._M_head_impl != (TypeEntry *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TypeEntry + 8))();
    local_58._M_head_impl = local_60;
  }
  local_60 = (TypeModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_58);
  if (local_58._M_head_impl != (TypeModuleField *)0x0) {
    (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_58._M_head_impl = (TypeModuleField *)0x0;
  if ((long *)local_50.filename.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_50.filename.data_ + 8))();
  }
  if (local_60 != (TypeModuleField *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFuncType(Index index,
                                  Index param_count,
                                  Type* param_types,
                                  Index result_count,
                                  Type* result_types) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto func_type = MakeUnique<FuncType>();
  func_type->sig.param_types.assign(param_types, param_types + param_count);
  func_type->sig.result_types.assign(result_types, result_types + result_count);
  field->type = std::move(func_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}